

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O3

void Fxch_ManDivDoubleCube(Fxch_Man_t *pFxchMan,int iCube,int fAdd,int fUpdate)

{
  int iVar1;
  Vec_Wec_t *vCubes;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char fUpdate_00;
  long lVar7;
  long lVar8;
  uint32_t iLit0;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint32_t uVar12;
  
  if ((iCube < 0) || (vCubes = pFxchMan->vCubes, vCubes->nSize <= iCube)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar2 = pFxchMan->vLitHashKeys;
  pVVar3 = vCubes->pArray;
  uVar12 = 0;
  if (1 < (long)pVVar3[(uint)iCube].nSize) {
    uVar12 = 0;
    lVar8 = 1;
    do {
      iVar1 = pVVar3[(uint)iCube].pArray[lVar8];
      if (((long)iVar1 < 0) || (pVVar2->nSize <= iVar1)) goto LAB_004c72de;
      uVar12 = uVar12 + pVVar2->pArray[iVar1];
      lVar8 = lVar8 + 1;
    } while (pVVar3[(uint)iCube].nSize != lVar8);
  }
  fUpdate_00 = (char)fUpdate;
  if (fAdd == 0) {
    Fxch_SCHashTableRemove(pFxchMan->pSCHashTable,vCubes,uVar12,iCube,0,0,fUpdate_00);
  }
  else {
    Fxch_SCHashTableInsert(pFxchMan->pSCHashTable,vCubes,uVar12,iCube,0,0,fUpdate_00);
  }
  if (1 < pVVar3[(uint)iCube].nSize) {
    lVar8 = 2;
    uVar9 = 1;
    do {
      iVar1 = pVVar3[(uint)iCube].pArray[uVar9];
      lVar7 = (long)iVar1;
      if ((lVar7 < 0) || (pVVar2->nSize <= iVar1)) {
LAB_004c72de:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar12 = uVar12 - pVVar2->pArray[lVar7];
      iLit0 = (uint32_t)uVar9;
      if (fAdd == 0) {
        iVar4 = Fxch_SCHashTableRemove
                          (pFxchMan->pSCHashTable,pFxchMan->vCubes,uVar12,iCube,iLit0,0,fUpdate_00);
      }
      else {
        iVar4 = Fxch_SCHashTableInsert
                          (pFxchMan->pSCHashTable,pFxchMan->vCubes,uVar12,iCube,iLit0,0,fUpdate_00);
      }
      pFxchMan->nPairsD = pFxchMan->nPairsD + iVar4;
      uVar6 = pVVar3[(uint)iCube].nSize;
      uVar9 = uVar9 + 1;
      lVar11 = lVar8;
      if (uVar9 < uVar6 && 2 < (int)uVar6) {
        do {
          iVar4 = pVVar3[(uint)iCube].pArray[lVar11];
          lVar10 = (long)iVar4;
          if ((lVar10 < 0) || (pVVar2->nSize <= iVar4)) goto LAB_004c72de;
          uVar12 = uVar12 - pVVar2->pArray[lVar10];
          if (fAdd == 0) {
            iVar5 = Fxch_SCHashTableRemove
                              (pFxchMan->pSCHashTable,pFxchMan->vCubes,uVar12,iCube,iLit0,
                               (uint32_t)lVar11,fUpdate_00);
          }
          else {
            iVar5 = Fxch_SCHashTableInsert
                              (pFxchMan->pSCHashTable,pFxchMan->vCubes,uVar12,iCube,iLit0,
                               (uint32_t)lVar11,fUpdate_00);
          }
          pFxchMan->nPairsD = pFxchMan->nPairsD + iVar5;
          if (pVVar2->nSize <= iVar4) goto LAB_004c72de;
          uVar12 = uVar12 + pVVar2->pArray[lVar10];
          lVar11 = lVar11 + 1;
          uVar6 = pVVar3[(uint)iCube].nSize;
        } while ((int)lVar11 < (int)uVar6);
      }
      if (pVVar2->nSize <= iVar1) goto LAB_004c72de;
      uVar12 = uVar12 + pVVar2->pArray[lVar7];
      lVar8 = lVar8 + 1;
    } while ((long)uVar9 < (long)(int)uVar6);
  }
  return;
}

Assistant:

static inline void Fxch_ManDivDoubleCube( Fxch_Man_t* pFxchMan,
                                          int iCube,
                                          int fAdd,
                                          int fUpdate )
{
    Vec_Int_t* vLitHashKeys = pFxchMan->vLitHashKeys,
             * vCube = Vec_WecEntry( pFxchMan->vCubes, iCube );
    int SubCubeID = 0,
        iLit0,
        Lit0;

    Vec_IntForEachEntryStart( vCube, Lit0, iLit0, 1)
        SubCubeID += Vec_IntEntry( vLitHashKeys, Lit0 );

    Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                         iCube, 0, 0,
                         (char)fAdd, (char)fUpdate );

    Vec_IntForEachEntryStart( vCube, Lit0, iLit0, 1)
    {
        /* 1 Lit remove */
        SubCubeID -= Vec_IntEntry( vLitHashKeys, Lit0 );

        pFxchMan->nPairsD += Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                                                  iCube, iLit0, 0,
                                                  (char)fAdd, (char)fUpdate );

        if ( Vec_IntSize( vCube ) >= 3 )
        {
            int Lit1,
                iLit1;

            Vec_IntForEachEntryStart( vCube, Lit1, iLit1, iLit0 + 1)
            {
                /* 2 Lit remove */
                SubCubeID -= Vec_IntEntry( vLitHashKeys, Lit1 );

                pFxchMan->nPairsD += Fxch_ManSCAddRemove( pFxchMan, SubCubeID,
                                                          iCube, iLit0, iLit1,
                                                          (char)fAdd, (char)fUpdate );

                SubCubeID += Vec_IntEntry( vLitHashKeys, Lit1 );
            }
        }

        SubCubeID += Vec_IntEntry( vLitHashKeys, Lit0 );
    }
}